

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O0

void __thiscall CArgumentList::Add(CArgumentList *this,CArgument *_argument)

{
  unique_ptr<CArgument,_std::default_delete<CArgument>_> local_20;
  CArgument *local_18;
  CArgument *_argument_local;
  CArgumentList *this_local;
  
  local_18 = _argument;
  _argument_local = (CArgument *)this;
  std::unique_ptr<CArgument,std::default_delete<CArgument>>::
  unique_ptr<std::default_delete<CArgument>,void>
            ((unique_ptr<CArgument,std::default_delete<CArgument>> *)&local_20,_argument);
  std::
  vector<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>,_std::allocator<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>_>_>
  ::push_back(&this->arguments,(value_type *)&local_20);
  std::unique_ptr<CArgument,_std::default_delete<CArgument>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

void CArgumentList::Add(CArgument* _argument) {
	arguments.push_back(std::unique_ptr<CArgument>(_argument));
}